

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_atomics.cpp
# Opt level: O2

spv_result_t spvtools::val::AtomicsPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  undefined2 uVar2;
  _Head_base<1UL,_bool,_false> _Var3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  spv_result_t sVar7;
  uint32_t uVar8;
  char *pcVar9;
  Instruction *pIVar10;
  uint uVar11;
  uint operand_index;
  bool bVar12;
  Op opcode;
  uint32_t data_type;
  undefined8 local_238;
  StorageClass storage_class;
  uint local_22c;
  undefined1 local_228 [464];
  spv_result_t local_58;
  string local_50;
  
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  if ((((0xf < uVar1 - 0xe3) && (1 < opcode - OpAtomicFlagTestAndSet)) &&
      (1 < opcode - OpAtomicFMinEXT)) && (opcode != OpAtomicFAddEXT)) {
    return SPV_SUCCESS;
  }
  uVar8 = (inst->inst_).type_id;
  if (uVar1 - 0x15ee < 2) {
LAB_0054f9c4:
    bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,AtomicFloat16VectorNV);
    if (((bVar4) && (bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar8), bVar4)) ||
       (bVar4 = ValidationState_t::IsFloatScalarType(_,uVar8), bVar4)) {
LAB_0054fa8b:
      if (((uVar1 - 0xe3 & 0xfffffffd) == 0) &&
         (bVar4 = ValidationState_t::IsFloatScalarType(_,uVar8), !bVar4)) {
        if (((opcode == OpAtomicExchange) &&
            (bVar4 = EnumSet<spv::Capability>::contains
                               (&_->module_capabilities_,AtomicFloat16VectorNV), bVar4)) &&
           (bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar8), bVar4)) goto LAB_0054fb03;
        bVar4 = ValidationState_t::IsIntScalarType(_,uVar8);
        if (!bVar4) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar9 = spvOpcodeString(opcode);
          std::operator<<((ostream *)local_228,pcVar9);
          pcVar9 = ": expected Result Type to be integer or float scalar type";
          goto LAB_0055055b;
        }
      }
      if ((opcode != OpAtomicFlagTestAndSet) ||
         (bVar4 = ValidationState_t::IsBoolScalarType(_,uVar8), bVar4)) goto LAB_0054fb03;
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = spvOpcodeString(OpAtomicFlagTestAndSet);
      std::operator<<((ostream *)local_228,pcVar9);
      pcVar9 = ": expected Result Type to be bool scalar type";
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = spvOpcodeString(opcode);
      std::operator<<((ostream *)local_228,pcVar9);
      pcVar9 = ": expected Result Type to be float scalar type";
    }
  }
  else if ((uVar1 == 0xe4) || (uVar1 == 0x13f)) {
LAB_0054fb03:
    bVar12 = opcode != OpAtomicStore && uVar1 != 0x13f;
    uVar11 = (uint)bVar12 * 2;
    uVar5 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)uVar11);
    data_type = 0;
    bVar4 = ValidationState_t::GetPointerTypeInfo(_,uVar5,&data_type,&storage_class);
    if (bVar4) {
      uVar5 = data_type;
      if (data_type != 0) goto LAB_0054fb5f;
      if (0xd < opcode - OpAtomicExchange) {
        if (1 < opcode - OpAtomicFlagTestAndSet) {
          if ((opcode - OpAtomicFMinEXT < 2) || (opcode == OpAtomicFAddEXT)) goto LAB_0054fb57;
          if (opcode == OpAtomicStore) {
            uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar10 = ValidationState_t::FindDef(_,uVar6);
            uVar5 = (pIVar10->inst_).type_id;
            data_type = uVar5;
          }
          else {
            uVar5 = 0;
            if (opcode == OpAtomicLoad) goto LAB_0054fb57;
          }
          goto LAB_0054fb5f;
        }
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar9 = "Untyped pointers are not supported by atomic flag instructions";
LAB_00550141:
        std::operator<<((ostream *)local_228,pcVar9);
        goto LAB_0055056d;
      }
LAB_0054fb57:
      uVar5 = (inst->inst_).type_id;
      data_type = uVar5;
LAB_0054fb5f:
      bVar4 = ValidationState_t::IsIntScalarType(_,uVar5);
      if (((!bVar4) || (uVar5 = ValidationState_t::GetBitWidth(_,data_type), uVar5 != 0x40)) ||
         (bVar4 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityInt64Atomics), bVar4)) {
        if (((storage_class < (StorageBuffer|Input)) &&
            ((0x1db4U >> (storage_class & 0x1f) & 1) != 0)) ||
           ((storage_class == PhysicalStorageBuffer ||
            (storage_class == StorageClassTaskPayloadWorkgroupEXT)))) {
          local_238 = &_->module_capabilities_;
          bVar4 = EnumSet<spv::Capability>::contains(local_238,CapabilityShader);
          if (bVar4) {
            bVar4 = spvIsVulkanEnv(_->context_->target_env);
            if (bVar4) {
              if (((StorageBuffer < storage_class) || ((0x1814U >> (storage_class & 0x1f) & 1) == 0)
                  ) && ((storage_class != PhysicalStorageBuffer &&
                        (storage_class != StorageClassTaskPayloadWorkgroupEXT)))) {
                ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                ValidationState_t::VkErrorID_abi_cxx11_(&local_50,_,0x124e,(char *)0x0);
                std::operator<<((ostream *)local_228,(string *)&local_50);
                pcVar9 = spvOpcodeString(opcode);
                std::operator<<((ostream *)local_228,pcVar9);
                std::operator<<((ostream *)local_228,
                                ": Vulkan spec only allows storage classes for atomic to be: Uniform, Workgroup, Image, StorageBuffer, PhysicalStorageBuffer or TaskPayloadWorkgroupEXT."
                               );
                std::__cxx11::string::_M_dispose();
                goto LAB_0055056d;
              }
            }
            else if (storage_class == Function) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = spvOpcodeString(opcode);
              std::operator<<((ostream *)local_228,pcVar9);
              pcVar9 = ": Function storage class forbidden when the Shader capability is declared.";
              goto LAB_0055055b;
            }
            if (opcode == OpAtomicFAddEXT) {
              uVar5 = ValidationState_t::GetBitWidth(_,uVar8);
              if (uVar5 == 0x10) {
                bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar8);
                if (bVar4) {
                  bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat16VectorNV);
                  if (!bVar4) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar9 = spvOpcodeString(OpAtomicFAddEXT);
                    std::operator<<((ostream *)local_228,pcVar9);
                    pcVar9 = ": float vector atomics require the AtomicFloat16VectorNV capability";
                    goto LAB_00550141;
                  }
                  goto LAB_0054ffaa;
                }
                bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat16AddEXT);
                if (bVar4) goto LAB_0054ffaa;
              }
              else {
LAB_0054ffaa:
                uVar5 = ValidationState_t::GetBitWidth(_,uVar8);
                if ((uVar5 != 0x20) ||
                   (bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat32AddEXT), bVar4
                   )) {
                  uVar5 = ValidationState_t::GetBitWidth(_,uVar8);
                  if ((uVar5 == 0x40) &&
                     (bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat64AddEXT),
                     !bVar4)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar9 = spvOpcodeString(OpAtomicFAddEXT);
                    std::operator<<((ostream *)local_228,pcVar9);
                    pcVar9 = ": float add atomics require the AtomicFloat64AddEXT capability";
                    goto LAB_00550141;
                  }
                  goto LAB_005500ec;
                }
              }
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = spvOpcodeString(OpAtomicFAddEXT);
              std::operator<<((ostream *)local_228,pcVar9);
              pcVar9 = ": float add atomics require the AtomicFloat32AddEXT capability";
              goto LAB_00550141;
            }
            if ((opcode & ~OpUndef) == OpAtomicFMinEXT) {
              uVar5 = ValidationState_t::GetBitWidth(_,uVar8);
              if (uVar5 == 0x10) {
                bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,uVar8);
                if (bVar4) {
                  bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat16VectorNV);
                  if (bVar4) goto LAB_0055009e;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar9 = spvOpcodeString(opcode);
                  std::operator<<((ostream *)local_228,pcVar9);
                  pcVar9 = ": float vector atomics require the AtomicFloat16VectorNV capability";
                }
                else {
                  bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat16MinMaxEXT);
                  if (bVar4) goto LAB_0055009e;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar9 = spvOpcodeString(opcode);
                  std::operator<<((ostream *)local_228,pcVar9);
                  pcVar9 = ": float min/max atomics require the AtomicFloat16MinMaxEXT capability";
                }
              }
              else {
LAB_0055009e:
                uVar5 = ValidationState_t::GetBitWidth(_,uVar8);
                if ((uVar5 != 0x20) ||
                   (bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat32MinMaxEXT),
                   bVar4)) {
                  uVar5 = ValidationState_t::GetBitWidth(_,uVar8);
                  if ((uVar5 != 0x40) ||
                     (bVar4 = EnumSet<spv::Capability>::contains(local_238,AtomicFloat64MinMaxEXT),
                     bVar4)) goto LAB_005500ec;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar9 = spvOpcodeString(opcode);
                  std::operator<<((ostream *)local_228,pcVar9);
                  pcVar9 = ": float min/max atomics require the AtomicFloat64MinMaxEXT capability";
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar9 = spvOpcodeString(opcode);
                  std::operator<<((ostream *)local_228,pcVar9);
                  pcVar9 = ": float min/max atomics require the AtomicFloat32MinMaxEXT capability";
                }
              }
              goto LAB_0055055b;
            }
          }
LAB_005500ec:
          bVar4 = spvIsOpenCLEnv(_->context_->target_env);
          if (bVar4) {
            if ((Generic < storage_class) || ((0x1b0U >> (storage_class & 0x1f) & 1) == 0)) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = spvOpcodeString(opcode);
              std::operator<<((ostream *)local_228,pcVar9);
              pcVar9 = 
              ": storage class must be Function, Workgroup, CrossWorkGroup or Generic in the OpenCL environment."
              ;
              goto LAB_0055055b;
            }
            if ((storage_class == Generic) && (_->context_->target_env == SPV_ENV_OPENCL_1_2)) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = "Storage class cannot be Generic in OpenCL 1.2 environment";
              goto LAB_00550141;
            }
          }
          local_238 = (EnumSet<spv::Capability> *)
                      (CONCAT44(local_238._4_4_,opcode) & 0xfffffffffffffffe);
          if ((opcode & ~OpUndef) == OpAtomicFlagTestAndSet) {
            bVar4 = ValidationState_t::IsIntScalarType(_,data_type);
            if ((!bVar4) || (uVar5 = ValidationState_t::GetBitWidth(_,data_type), uVar5 != 0x20)) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = spvOpcodeString(opcode);
              std::operator<<((ostream *)local_228,pcVar9);
              pcVar9 = ": expected Pointer to point to a value of 32-bit integer type";
              goto LAB_0055055b;
            }
          }
          else if (opcode == OpAtomicStore) {
            bVar4 = ValidationState_t::IsFloatScalarType(_,data_type);
            if ((!bVar4) && (bVar4 = ValidationState_t::IsIntScalarType(_,data_type), !bVar4)) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = spvOpcodeString(OpAtomicStore);
              std::operator<<((ostream *)local_228,pcVar9);
              std::operator<<((ostream *)local_228,
                              ": expected Pointer to be a pointer to integer or float ");
              pcVar9 = "scalar type";
              goto LAB_00550141;
            }
          }
          else if (data_type != uVar8) {
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar9 = spvOpcodeString(opcode);
            std::operator<<((ostream *)local_228,pcVar9);
            pcVar9 = ": expected Pointer to point to a value of type Result Type";
            goto LAB_0055055b;
          }
          uVar6 = Instruction::GetOperandAs<unsigned_int_const>(inst,(ulong)((uint)bVar12 * 2 + 1));
          sVar7 = ValidateMemoryScope(_,inst,uVar6);
          if (sVar7 != SPV_SUCCESS) {
            return sVar7;
          }
          uVar5 = uVar11 + 2;
          sVar7 = ValidateMemorySemantics(_,inst,uVar5,uVar6);
          if (sVar7 != SPV_SUCCESS) {
            return sVar7;
          }
          operand_index = uVar11 + 3;
          local_22c = uVar5;
          if ((int)local_238 == 0xe6) {
            sVar7 = ValidateMemorySemantics(_,inst,operand_index,uVar6);
            if (sVar7 != SPV_SUCCESS) {
              return sVar7;
            }
            uVar11 = uVar11 | 4;
            uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)local_22c);
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)local_228,_,uVar6);
            _Var3._M_head_impl = local_228[4];
            uVar2 = local_228._0_2_;
            uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)operand_index);
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)local_228,_,uVar6);
            operand_index = uVar11;
            if (((_Var3._M_head_impl == true) && (local_228[4] != false)) &&
               ((short)(local_228._0_2_ ^ uVar2) < 0)) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              pcVar9 = "Volatile mask setting must match for Equal and Unequal memory semantics";
              goto LAB_00550141;
            }
          }
          if (((1 < opcode - OpAtomicIIncrement) && (1 < opcode - OpAtomicFlagTestAndSet)) &&
             (opcode != OpAtomicLoad)) {
            if (opcode == OpAtomicStore) {
              uVar8 = ValidationState_t::GetOperandTypeId(_,inst,3);
              if (uVar8 == data_type) {
                return SPV_SUCCESS;
              }
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = spvOpcodeString(OpAtomicStore);
              std::operator<<((ostream *)local_228,pcVar9);
              pcVar9 = ": expected Value type and the type pointed to by Pointer to be the same";
              goto LAB_00550141;
            }
            uVar5 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)operand_index);
            if (uVar5 != uVar8) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar9 = spvOpcodeString(opcode);
              std::operator<<((ostream *)local_228,pcVar9);
              pcVar9 = ": expected Value to be of type Result Type";
              goto LAB_0055055b;
            }
            operand_index = operand_index + 1;
          }
          if (((int)local_238 != 0xe6) ||
             (uVar5 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)operand_index),
             uVar5 == uVar8)) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar9 = spvOpcodeString(opcode);
          std::operator<<((ostream *)local_228,pcVar9);
          pcVar9 = ": expected Comparator to be of type Result Type";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar9 = spvOpcodeString(opcode);
          std::operator<<((ostream *)local_228,pcVar9);
          pcVar9 = ": storage class forbidden by universal validation rules.";
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = spvOpcodeString(opcode);
        std::operator<<((ostream *)local_228,pcVar9);
        pcVar9 = ": 64-bit atomics require the Int64Atomics capability";
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = spvOpcodeString(opcode);
      std::operator<<((ostream *)local_228,pcVar9);
      pcVar9 = ": expected Pointer to be a pointer type";
    }
  }
  else {
    if (uVar1 == 0x1793) goto LAB_0054f9c4;
    if ((0xc < opcode - OpAtomicCompareExchange) ||
       (bVar4 = ValidationState_t::IsIntScalarType(_,uVar8), bVar4)) goto LAB_0054fa8b;
    ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = spvOpcodeString(opcode);
    std::operator<<((ostream *)local_228,pcVar9);
    pcVar9 = ": expected Result Type to be integer scalar type";
  }
LAB_0055055b:
  std::operator<<((ostream *)local_228,pcVar9);
LAB_0055056d:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
  return local_58;
}

Assistant:

spv_result_t AtomicsPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpAtomicLoad:
    case spv::Op::OpAtomicStore:
    case spv::Op::OpAtomicExchange:
    case spv::Op::OpAtomicFAddEXT:
    case spv::Op::OpAtomicCompareExchange:
    case spv::Op::OpAtomicCompareExchangeWeak:
    case spv::Op::OpAtomicIIncrement:
    case spv::Op::OpAtomicIDecrement:
    case spv::Op::OpAtomicIAdd:
    case spv::Op::OpAtomicISub:
    case spv::Op::OpAtomicSMin:
    case spv::Op::OpAtomicUMin:
    case spv::Op::OpAtomicFMinEXT:
    case spv::Op::OpAtomicSMax:
    case spv::Op::OpAtomicUMax:
    case spv::Op::OpAtomicFMaxEXT:
    case spv::Op::OpAtomicAnd:
    case spv::Op::OpAtomicOr:
    case spv::Op::OpAtomicXor:
    case spv::Op::OpAtomicFlagTestAndSet:
    case spv::Op::OpAtomicFlagClear: {
      const uint32_t result_type = inst->type_id();

      // Validate return type first so can just check if pointer type is same
      // (if applicable)
      if (HasReturnType(opcode)) {
        if (HasOnlyFloatReturnType(opcode) &&
            (!(_.HasCapability(spv::Capability::AtomicFloat16VectorNV) &&
               _.IsFloat16Vector2Or4Type(result_type)) &&
             !_.IsFloatScalarType(result_type))) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be float scalar type";
        } else if (HasOnlyIntReturnType(opcode) &&
                   !_.IsIntScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be integer scalar type";
        } else if (HasIntOrFloatReturnType(opcode) &&
                   !_.IsFloatScalarType(result_type) &&
                   !(opcode == spv::Op::OpAtomicExchange &&
                     _.HasCapability(spv::Capability::AtomicFloat16VectorNV) &&
                     _.IsFloat16Vector2Or4Type(result_type)) &&
                   !_.IsIntScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be integer or float scalar type";
        } else if (HasOnlyBoolReturnType(opcode) &&
                   !_.IsBoolScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be bool scalar type";
        }
      }

      uint32_t operand_index = HasReturnType(opcode) ? 2 : 0;
      const uint32_t pointer_type = _.GetOperandTypeId(inst, operand_index++);
      uint32_t data_type = 0;
      spv::StorageClass storage_class;
      if (!_.GetPointerTypeInfo(pointer_type, &data_type, &storage_class)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Pointer to be a pointer type";
      }

      // If the pointer is an untyped pointer, get the data type elsewhere.
      if (data_type == 0) {
        switch (opcode) {
          case spv::Op::OpAtomicLoad:
          case spv::Op::OpAtomicExchange:
          case spv::Op::OpAtomicFAddEXT:
          case spv::Op::OpAtomicCompareExchange:
          case spv::Op::OpAtomicCompareExchangeWeak:
          case spv::Op::OpAtomicIIncrement:
          case spv::Op::OpAtomicIDecrement:
          case spv::Op::OpAtomicIAdd:
          case spv::Op::OpAtomicISub:
          case spv::Op::OpAtomicSMin:
          case spv::Op::OpAtomicUMin:
          case spv::Op::OpAtomicFMinEXT:
          case spv::Op::OpAtomicSMax:
          case spv::Op::OpAtomicUMax:
          case spv::Op::OpAtomicFMaxEXT:
          case spv::Op::OpAtomicAnd:
          case spv::Op::OpAtomicOr:
          case spv::Op::OpAtomicXor:
            data_type = inst->type_id();
            break;
          case spv::Op::OpAtomicFlagTestAndSet:
          case spv::Op::OpAtomicFlagClear:
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Untyped pointers are not supported by atomic flag "
                      "instructions";
            break;
          case spv::Op::OpAtomicStore:
            data_type = _.FindDef(inst->GetOperandAs<uint32_t>(3))->type_id();
            break;
          default:
            break;
        }
      }

      // Can't use result_type because OpAtomicStore doesn't have a result
      if (_.IsIntScalarType(data_type) && _.GetBitWidth(data_type) == 64 &&
          !_.HasCapability(spv::Capability::Int64Atomics)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": 64-bit atomics require the Int64Atomics capability";
      }

      // Validate storage class against universal rules
      if (!IsStorageClassAllowedByUniversalRules(storage_class)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": storage class forbidden by universal validation rules.";
      }

      // Then Shader rules
      if (_.HasCapability(spv::Capability::Shader)) {
        // Vulkan environment rule
        if (spvIsVulkanEnv(_.context()->target_env)) {
          if ((storage_class != spv::StorageClass::Uniform) &&
              (storage_class != spv::StorageClass::StorageBuffer) &&
              (storage_class != spv::StorageClass::Workgroup) &&
              (storage_class != spv::StorageClass::Image) &&
              (storage_class != spv::StorageClass::PhysicalStorageBuffer) &&
              (storage_class != spv::StorageClass::TaskPayloadWorkgroupEXT)) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << _.VkErrorID(4686) << spvOpcodeString(opcode)
                   << ": Vulkan spec only allows storage classes for atomic to "
                      "be: Uniform, Workgroup, Image, StorageBuffer, "
                      "PhysicalStorageBuffer or TaskPayloadWorkgroupEXT.";
          }
        } else if (storage_class == spv::StorageClass::Function) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": Function storage class forbidden when the Shader "
                    "capability is declared.";
        }

        if (opcode == spv::Op::OpAtomicFAddEXT) {
          // result type being float checked already
          if (_.GetBitWidth(result_type) == 16) {
            if (_.IsFloat16Vector2Or4Type(result_type)) {
              if (!_.HasCapability(spv::Capability::AtomicFloat16VectorNV))
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float vector atomics require the "
                          "AtomicFloat16VectorNV capability";
            } else {
              if (!_.HasCapability(spv::Capability::AtomicFloat16AddEXT)) {
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float add atomics require the AtomicFloat32AddEXT "
                          "capability";
              }
            }
          }
          if ((_.GetBitWidth(result_type) == 32) &&
              (!_.HasCapability(spv::Capability::AtomicFloat32AddEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float add atomics require the AtomicFloat32AddEXT "
                      "capability";
          }
          if ((_.GetBitWidth(result_type) == 64) &&
              (!_.HasCapability(spv::Capability::AtomicFloat64AddEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float add atomics require the AtomicFloat64AddEXT "
                      "capability";
          }
        } else if (opcode == spv::Op::OpAtomicFMinEXT ||
                   opcode == spv::Op::OpAtomicFMaxEXT) {
          if (_.GetBitWidth(result_type) == 16) {
            if (_.IsFloat16Vector2Or4Type(result_type)) {
              if (!_.HasCapability(spv::Capability::AtomicFloat16VectorNV))
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float vector atomics require the "
                          "AtomicFloat16VectorNV capability";
            } else {
              if (!_.HasCapability(spv::Capability::AtomicFloat16MinMaxEXT)) {
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float min/max atomics require the "
                          "AtomicFloat16MinMaxEXT capability";
              }
            }
          }
          if ((_.GetBitWidth(result_type) == 32) &&
              (!_.HasCapability(spv::Capability::AtomicFloat32MinMaxEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float min/max atomics require the "
                      "AtomicFloat32MinMaxEXT capability";
          }
          if ((_.GetBitWidth(result_type) == 64) &&
              (!_.HasCapability(spv::Capability::AtomicFloat64MinMaxEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float min/max atomics require the "
                      "AtomicFloat64MinMaxEXT capability";
          }
        }
      }

      // And finally OpenCL environment rules
      if (spvIsOpenCLEnv(_.context()->target_env)) {
        if ((storage_class != spv::StorageClass::Function) &&
            (storage_class != spv::StorageClass::Workgroup) &&
            (storage_class != spv::StorageClass::CrossWorkgroup) &&
            (storage_class != spv::StorageClass::Generic)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": storage class must be Function, Workgroup, "
                    "CrossWorkGroup or Generic in the OpenCL environment.";
        }

        if (_.context()->target_env == SPV_ENV_OPENCL_1_2) {
          if (storage_class == spv::StorageClass::Generic) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << "Storage class cannot be Generic in OpenCL 1.2 "
                      "environment";
          }
        }
      }

      // If result and pointer type are different, need to do special check here
      if (opcode == spv::Op::OpAtomicFlagTestAndSet ||
          opcode == spv::Op::OpAtomicFlagClear) {
        if (!_.IsIntScalarType(data_type) || _.GetBitWidth(data_type) != 32) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Pointer to point to a value of 32-bit integer "
                    "type";
        }
      } else if (opcode == spv::Op::OpAtomicStore) {
        if (!_.IsFloatScalarType(data_type) && !_.IsIntScalarType(data_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Pointer to be a pointer to integer or float "
                 << "scalar type";
        }
      } else if (data_type != result_type) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Pointer to point to a value of type Result "
                  "Type";
      }

      auto memory_scope = inst->GetOperandAs<const uint32_t>(operand_index++);
      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      const auto equal_semantics_index = operand_index++;
      if (auto error = ValidateMemorySemantics(_, inst, equal_semantics_index,
                                               memory_scope))
        return error;

      if (opcode == spv::Op::OpAtomicCompareExchange ||
          opcode == spv::Op::OpAtomicCompareExchangeWeak) {
        const auto unequal_semantics_index = operand_index++;
        if (auto error = ValidateMemorySemantics(
                _, inst, unequal_semantics_index, memory_scope))
          return error;

        // Volatile bits must match for equal and unequal semantics. Previous
        // checks guarantee they are 32-bit constants, but we need to recheck
        // whether they are evaluatable constants.
        bool is_int32 = false;
        bool is_equal_const = false;
        bool is_unequal_const = false;
        uint32_t equal_value = 0;
        uint32_t unequal_value = 0;
        std::tie(is_int32, is_equal_const, equal_value) = _.EvalInt32IfConst(
            inst->GetOperandAs<uint32_t>(equal_semantics_index));
        std::tie(is_int32, is_unequal_const, unequal_value) =
            _.EvalInt32IfConst(
                inst->GetOperandAs<uint32_t>(unequal_semantics_index));
        if (is_equal_const && is_unequal_const &&
            ((equal_value & uint32_t(spv::MemorySemanticsMask::Volatile)) ^
             (unequal_value & uint32_t(spv::MemorySemanticsMask::Volatile)))) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Volatile mask setting must match for Equal and Unequal "
                    "memory semantics";
        }
      }

      if (opcode == spv::Op::OpAtomicStore) {
        const uint32_t value_type = _.GetOperandTypeId(inst, 3);
        if (value_type != data_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Value type and the type pointed to by "
                    "Pointer to be the same";
        }
      } else if (opcode != spv::Op::OpAtomicLoad &&
                 opcode != spv::Op::OpAtomicIIncrement &&
                 opcode != spv::Op::OpAtomicIDecrement &&
                 opcode != spv::Op::OpAtomicFlagTestAndSet &&
                 opcode != spv::Op::OpAtomicFlagClear) {
        const uint32_t value_type = _.GetOperandTypeId(inst, operand_index++);
        if (value_type != result_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Value to be of type Result Type";
        }
      }

      if (opcode == spv::Op::OpAtomicCompareExchange ||
          opcode == spv::Op::OpAtomicCompareExchangeWeak) {
        const uint32_t comparator_type =
            _.GetOperandTypeId(inst, operand_index++);
        if (comparator_type != result_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Comparator to be of type Result Type";
        }
      }

      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}